

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Data_R_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Data_R_PDU::Data_R_PDU
          (Data_R_PDU *this,EntityIdentifier *OriginatingEntityID,
          EntityIdentifier *ReceivingEntityID,KUINT32 RequestID,RequiredReliabilityService RRS)

{
  Comment_PDU *pCVar1;
  
  Data_PDU::Data_PDU(&this->super_Data_PDU,OriginatingEntityID,ReceivingEntityID,RequestID);
  Reliability_Header::Reliability_Header(&this->super_Reliability_Header,RRS);
  (this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.super_Header.
  super_Header6._vptr_Header6 = (_func_int **)&PTR__Data_R_PDU_002229f8;
  (this->super_Reliability_Header)._vptr_Reliability_Header =
       (_func_int **)&PTR__Data_R_PDU_00222a40;
  pCVar1 = &(this->super_Data_PDU).super_Comment_PDU;
  (pCVar1->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8PDUType = '<';
  (pCVar1->super_Simulation_Management_Header).super_Header.super_Header6.m_ui8ProtocolFamily = '\n'
  ;
  (this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.super_Header.
  super_Header6.m_ui16PDULength = 0x28;
  (this->super_Data_PDU).super_Comment_PDU.super_Simulation_Management_Header.super_Header.
  super_Header6.m_ui8ProtocolVersion = '\x06';
  return;
}

Assistant:

Data_R_PDU::Data_R_PDU( const EntityIdentifier & OriginatingEntityID, const EntityIdentifier & ReceivingEntityID,
                        KUINT32 RequestID, RequiredReliabilityService RRS ) :
    Data_PDU( OriginatingEntityID, ReceivingEntityID, RequestID ),
    Reliability_Header( RRS )
{
    m_ui8PDUType = Data_R_PDU_Type;
    m_ui16PDULength = DATA_R_PDU_SIZE;
    m_ui8ProtocolVersion = IEEE_1278_1A_1998;
    m_ui8ProtocolFamily = SimulationManagementwithReliability;
}